

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pTextureCases.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::Texture2DRenderCase::setupProgram
          (Texture2DRenderCase *this,deUint32 program)

{
  long *plVar1;
  code *pcVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 extraout_var;
  undefined8 *puVar5;
  int iVar6;
  ulong uVar7;
  long *local_210;
  long local_200;
  undefined4 uStack_1f8;
  undefined4 uStack_1f4;
  ulong *local_1f0;
  long local_1e8;
  ulong local_1e0 [2];
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  Texture2DRenderCase *local_1b0;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar3 = (*((this->super_ShaderPerformanceCase).m_renderCtx)->_vptr_RenderContext[3])();
  if (0 < this->m_numTextures) {
    iVar6 = 0;
    local_1b0 = this;
    do {
      pcVar2 = *(code **)(CONCAT44(extraout_var,iVar3) + 0xb48);
      local_1d0 = local_1c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"u_sampler","");
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::ostream::operator<<(local_1a8,iVar6);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a8);
      std::ios_base::~ios_base(local_138);
      uVar7 = 0xf;
      if (local_1d0 != local_1c0) {
        uVar7 = local_1c0[0];
      }
      if (uVar7 < (ulong)(local_1e8 + local_1c8)) {
        uVar7 = 0xf;
        if (local_1f0 != local_1e0) {
          uVar7 = local_1e0[0];
        }
        if (uVar7 < (ulong)(local_1e8 + local_1c8)) goto LAB_013a84c5;
        puVar5 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,(ulong)local_1d0);
      }
      else {
LAB_013a84c5:
        puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1f0);
      }
      plVar1 = puVar5 + 2;
      if ((long *)*puVar5 == plVar1) {
        local_200 = *plVar1;
        uStack_1f8 = *(undefined4 *)(puVar5 + 3);
        uStack_1f4 = *(undefined4 *)((long)puVar5 + 0x1c);
        local_210 = &local_200;
      }
      else {
        local_200 = *plVar1;
        local_210 = (long *)*puVar5;
      }
      *puVar5 = plVar1;
      puVar5[1] = 0;
      *(undefined1 *)plVar1 = 0;
      uVar4 = (*pcVar2)(program,local_210);
      if (local_210 != &local_200) {
        operator_delete(local_210,local_200 + 1);
      }
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0,local_1c0[0] + 1);
      }
      (**(code **)(CONCAT44(extraout_var,iVar3) + 0x14f0))(uVar4,iVar6);
      iVar6 = iVar6 + 1;
    } while (iVar6 < local_1b0->m_numTextures);
  }
  return;
}

Assistant:

void Texture2DRenderCase::setupProgram (deUint32 program)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();
	for (int texNdx = 0; texNdx < m_numTextures; texNdx++)
	{
		int samplerLoc = gl.getUniformLocation(program, (string("u_sampler") + de::toString(texNdx)).c_str());
		gl.uniform1i(samplerLoc, texNdx);
	}
}